

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

int nni_sock_add_listener(nni_sock *s,nni_listener *l)

{
  nni_mtx *mtx;
  nni_type t;
  char *name;
  int iVar1;
  long lVar2;
  undefined1 local_48 [8];
  uint64_t val;
  nni_listener *local_38;
  
  iVar1 = nni_listener_hold(l);
  if (iVar1 == 0) {
    local_38 = l;
    for (lVar2 = 8; lVar2 != 0x38; lVar2 = lVar2 + 0x10) {
      name = *(char **)(pipe_stats_init_listener_info + lVar2 + 0x18);
      t = *(nni_type *)((long)&ep_options[0].eo_name + lVar2);
      iVar1 = nni_sock_getopt(s,name,local_48,(size_t *)0x0,t);
      if (iVar1 == 0) {
        iVar1 = nni_listener_setopt(local_38,name,local_48,0,t);
      }
      if ((iVar1 != 0) && (iVar1 != 9)) {
        nni_listener_rele(local_38);
        val._4_4_ = iVar1;
      }
      if ((iVar1 != 9) && (iVar1 != 0)) {
        return val._4_4_;
      }
    }
    mtx = &s->s_mx;
    nni_mtx_lock(mtx);
    if (s->s_closing == true) {
      nni_mtx_unlock(mtx);
      nni_listener_rele(local_38);
      iVar1 = 7;
    }
    else {
      nni_list_append(&s->s_listeners,local_38);
      nni_stat_inc(&s->st_listeners,1);
      nni_mtx_unlock(mtx);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
nni_sock_add_listener(nni_sock *s, nni_listener *l)
{
	int rv;

	// grab a hold on the listener for the socket
	if ((rv = nni_listener_hold(l)) != 0) {
		return (rv);
	}

	// copy initial values for some options from socket
	for (int i = 0; ep_options[i].eo_name != NULL; i++) {
		uint64_t             val; // big enough
		const nni_ep_option *o = &ep_options[i];
		rv = nni_sock_getopt(s, o->eo_name, &val, NULL, o->eo_type);
		if (rv == 0) {
			rv = nni_listener_setopt(
			    l, o->eo_name, &val, 0, o->eo_type);
		}
		if (rv != 0 && rv != NNG_ENOTSUP) {
			nni_listener_rele(l);
			return (rv);
		}
	}

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		nni_listener_rele(l);
		return (NNG_ECLOSED);
	}

	nni_list_append(&s->s_listeners, l);

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_listeners, 1);
#endif

	nni_mtx_unlock(&s->s_mx);
	return (0);
}